

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void duckdb::ListRangeFunction<duckdb::TimestampRangeInfo,true>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  reference pvVar4;
  uint64_t uVar5;
  Vector *pVVar6;
  timestamp_t left;
  idx_t i;
  ulong uVar7;
  uint64_t *puVar8;
  idx_t i_1;
  idx_t iVar9;
  long lVar10;
  INCREMENT_TYPE right;
  idx_t local_158;
  VectorType local_14c;
  idx_t local_140;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_true> info;
  
  RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RangeInfoStruct(&info,args);
  uVar7 = 0;
  local_140 = 1;
  do {
    if ((ulong)(((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= uVar7) {
      local_14c = CONSTANT_VECTOR;
      goto LAB_00cdcf93;
    }
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar7);
    uVar7 = uVar7 + 1;
  } while (pvVar4->vector_type == CONSTANT_VECTOR);
  local_140 = args->count;
  local_14c = FLAT_VECTOR;
LAB_00cdcf93:
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  puVar8 = (uint64_t *)(pdVar1 + 8);
  local_158 = 0;
  for (iVar9 = 0; local_140 != iVar9; iVar9 = iVar9 + 1) {
    bVar3 = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RowIsValid(&info,iVar9);
    if (bVar3) {
      puVar8[-1] = local_158;
      uVar5 = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::ListLength(&info,iVar9);
      *puVar8 = uVar5;
      local_158 = local_158 + uVar5;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar9);
      puVar8[-1] = local_158;
      *puVar8 = 0;
    }
    puVar8 = puVar8 + 2;
  }
  ListVector::Reserve(result,local_158);
  pVVar6 = ListVector::GetEntry(result);
  pdVar2 = pVVar6->data;
  lVar10 = 0;
  for (iVar9 = 0; iVar9 != local_140; iVar9 = iVar9 + 1) {
    left.value = (int64_t)RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::StartListValue
                                    (&info,iVar9);
    right = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::ListIncrementValue(&info,iVar9);
    for (uVar7 = 0; uVar7 < *(ulong *)(pdVar1 + iVar9 * 0x10 + 8); uVar7 = uVar7 + 1) {
      if (uVar7 != 0) {
        left = Interval::Add(left,right);
      }
      *(int64_t *)(pdVar2 + uVar7 * 8 + lVar10 * 8) = left.value;
    }
    lVar10 = lVar10 + uVar7;
  }
  ListVector::SetListSize(result,local_158);
  Vector::SetVectorType(result,local_14c);
  Vector::Verify(result,args->count);
  RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::~RangeInfoStruct(&info);
  return;
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}